

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dp.c
# Opt level: O0

DP_RS_Stream
DummyInitReader(CP_Services Svcs,void *CP_Stream,void **ReaderContactInfoPtr,_SstParams *Params,
               attr_list WriterContact,SstStats Stats)

{
  void *__s;
  undefined8 *__s_00;
  undefined8 uVar1;
  char *__s_01;
  undefined8 uVar2;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  CMFormat F;
  SMPI_Comm comm;
  char *DummyContactString;
  CManager cm;
  DummyReaderContactInfo Contact;
  Dummy_RS_Stream Stream;
  int *in_stack_ffffffffffffff98;
  SMPI_Comm in_stack_ffffffffffffffa0;
  
  __s = malloc(0x30);
  __s_00 = (undefined8 *)malloc(0x10);
  uVar1 = (**(code **)(in_RDI + 8))(in_RSI);
  __s_01 = (char *)malloc(0x40);
  (**(code **)(in_RDI + 0x18))(in_RSI);
  memset(__s,0,0x30);
  memset(__s_00,0,0x10);
  *(undefined8 *)((long)__s + 8) = in_RSI;
  SMPI_Comm_rank(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  snprintf(__s_01,0x40,"Reader Rank %d, test contact",(ulong)*(uint *)((long)__s + 0x18));
  uVar2 = CMregister_format(uVar1,DummyReadRequestStructs);
  *(undefined8 *)((long)__s + 0x10) = uVar2;
  uVar1 = CMregister_format(uVar1,DummyReadReplyStructs);
  CMregister_handler(uVar1,DummyReadReplyHandler,in_RDI);
  *__s_00 = __s_01;
  __s_00[1] = __s;
  *in_RDX = __s_00;
  return __s;
}

Assistant:

static DP_RS_Stream DummyInitReader(CP_Services Svcs, void *CP_Stream, void **ReaderContactInfoPtr,
                                    struct _SstParams *Params, attr_list WriterContact,
                                    SstStats Stats)
{
    Dummy_RS_Stream Stream = malloc(sizeof(struct _Dummy_RS_Stream));
    DummyReaderContactInfo Contact = malloc(sizeof(struct _DummyReaderContactInfo));
    CManager cm = Svcs->getCManager(CP_Stream);
    char *DummyContactString = malloc(64);
    SMPI_Comm comm = Svcs->getMPIComm(CP_Stream);
    CMFormat F;

    memset(Stream, 0, sizeof(*Stream));
    memset(Contact, 0, sizeof(*Contact));

    /*
     * save the CP_stream value of later use
     */
    Stream->CP_Stream = CP_Stream;

    SMPI_Comm_rank(comm, &Stream->Rank);

    snprintf(DummyContactString, 64, "Reader Rank %d, test contact", Stream->Rank);

    /*
     * add a handler for read reply messages
     */
    Stream->ReadRequestFormat = CMregister_format(cm, DummyReadRequestStructs);
    F = CMregister_format(cm, DummyReadReplyStructs);
    CMregister_handler(F, DummyReadReplyHandler, Svcs);

    Contact->ContactString = DummyContactString;
    Contact->RS_Stream = Stream;

    *ReaderContactInfoPtr = Contact;

    return Stream;
}